

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O1

void __thiscall
Darts::Details::AutoPool<Darts::Details::DawgNode>::resize
          (AutoPool<Darts::Details::DawgNode> *this,size_t size)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  
  if (size < this->size_) {
    this->size_ = size;
  }
  if (this->capacity_ < size) {
    resize_buf(this,size);
  }
  while (uVar3 = this->size_, uVar3 < size) {
    this->size_ = uVar3 + 1;
    pcVar2 = (this->buf_).array_;
    pcVar1 = pcVar2 + uVar3 * 0xc + 7;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar2 = pcVar2 + uVar3 * 0xc;
    pcVar2[0] = '\0';
    pcVar2[1] = '\0';
    pcVar2[2] = '\0';
    pcVar2[3] = '\0';
    pcVar2[4] = '\0';
    pcVar2[5] = '\0';
    pcVar2[6] = '\0';
    pcVar2[7] = '\0';
  }
  return;
}

Assistant:

void resize(std::size_t size) {
    while (size_ > size) {
      (*this)[--size_].~T();
    }
    if (size > capacity_) {
      resize_buf(size);
    }
    while (size_ < size) {
      new(&(*this)[size_++]) T;
    }
  }